

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int set_sort(lyxp_set *set,lyd_node *cur_node,int options)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  lyxp_set_node *plVar3;
  lyxp_set_node *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  lyd_node *root;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  lyxp_set_node item;
  undefined8 uStack_50;
  lyxp_node_type root_type;
  lyxp_set_hash_node hnode;
  undefined4 uStack_3c;
  
  iVar10 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (set->used != 1)) {
    root = moveto_get_root(cur_node,options,&item.pos);
    iVar9 = set_assign_pos(set,root,item.pos);
    iVar10 = -1;
    if (iVar9 == 0) {
      ly_log_dbg(8,"SORT BEGIN");
      print_set_debug(set);
      uVar14 = 0;
      if (set->used != 0) {
        uVar14 = 0;
        unique0x100004c0 = root;
        do {
          bVar8 = true;
          if (1 < set->used - uVar14) {
            lVar12 = 0;
            uVar13 = 1;
            bVar8 = false;
            bVar7 = false;
            do {
              if (bVar7) {
                plVar3 = (set->val).nodes;
                plVar4 = plVar3 + 1;
              }
              else {
                plVar4 = (set->val).nodes;
                plVar3 = plVar4 + 1;
              }
              iVar10 = set_sort_compare((lyxp_set_node *)((long)&plVar4->node + lVar12),
                                        (lyxp_set_node *)((long)&plVar3->node + lVar12),root);
              if (((bVar7) && (iVar10 < 0)) || ((!bVar7 && (0 < iVar10)))) {
                plVar3 = (set->val).nodes;
                puVar1 = (undefined8 *)((long)&plVar3->node + lVar12);
                uVar5 = *puVar1;
                item.node = (lyd_node *)puVar1[1];
                puVar2 = (undefined8 *)((long)&plVar3[1].node + lVar12);
                uVar6 = puVar2[1];
                puVar1 = (undefined8 *)((long)&plVar3->node + lVar12);
                *puVar1 = *puVar2;
                puVar1[1] = uVar6;
                puVar1 = (undefined8 *)((long)&(set->val).nodes[1].node + lVar12);
                *puVar1 = uVar5;
                puVar1[1] = item.node;
                bVar8 = true;
              }
              else {
                bVar7 = !bVar7;
              }
              uVar13 = uVar13 + 1;
              lVar12 = lVar12 + 0x10;
              root = stack0xffffffffffffffc0;
            } while (uVar13 < set->used - uVar14);
            bVar8 = !bVar8;
          }
          uVar14 = uVar14 + 1;
        } while ((!bVar8) && (uVar14 < set->used));
      }
      stack0xffffffffffffffc0 = (lyd_node *)CONCAT44(uStack_3c,uVar14);
      ly_log_dbg(8,"SORT END %d",(ulong)uVar14);
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (hash_table *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x604,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
        }
        if (set->used != 0) {
          lVar12 = 8;
          uVar13 = 0;
          do {
            uStack_50 = *(undefined8 *)((long)(set->val).nodes + lVar12 + -8);
            hnode.node._0_4_ = *(undefined4 *)((long)&((set->val).nodes)->node + lVar12);
            uVar11 = dict_hash_multi(0,(char *)&stack0xffffffffffffffb0,8);
            uVar11 = dict_hash_multi(uVar11,(char *)&hnode,4);
            uVar11 = dict_hash_multi(uVar11,(char *)0x0,0);
            iVar10 = lyht_find(set->ht,&stack0xffffffffffffffb0,uVar11,(void **)0x0);
            if (iVar10 != 0) {
              __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x60d,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
            }
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x10;
          } while (uVar13 < set->used);
        }
      }
      iVar10 = hnode.type - LYXP_NODE_ROOT_CONFIG;
    }
  }
  return iVar10;
}

Assistant:

static int
set_sort(struct lyxp_set *set, const struct lyd_node *cur_node, int options)
{
    uint32_t i, j;
    int ret = 0, cmp, inverted, change;
    const struct lyd_node *root;
    enum lyxp_node_type root_type;
    struct lyxp_set_node item;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used == 1)) {
        return 0;
    }

    /* get root */
    root = moveto_get_root(cur_node, options, &root_type);

    /* fill positions */
    if (set_assign_pos(set, root, root_type)) {
        return -1;
    }

    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1], root);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j], root);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);

#ifdef LY_ENABLED_CACHE
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    /* check node hashes */
    if (set->used >= LY_CACHE_HT_MIN_CHILDREN) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = dict_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }
#endif

    return ret - 1;
}